

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

void __thiscall ixy::IxgbeDevice::start_rx_queue(IxgbeDevice *this,uint16_t queue_id)

{
  ixgbe_adv_rx_desc *piVar1;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  unsigned_long *puVar5;
  uint64_t uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long lVar7;
  optional<unsigned_long> oVar8;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b8;
  int local_b4;
  ixgbe_adv_rx_desc *rxd;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_88;
  _Storage<unsigned_long,_true> local_78;
  optional<unsigned_long> buf;
  int i;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_58;
  reference local_50;
  value_type *queue;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_38;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> local_30;
  uint16_t local_12;
  IxgbeDevice *pIStack_10;
  uint16_t queue_id_local;
  IxgbeDevice *this_local;
  
  local_12 = queue_id;
  pIStack_10 = this;
  memset((void *)((long)&queue + 7),0,1);
  local_38 = ixy::operator<<("starting rx queue ");
  begin.list.second._0_4_ = in_stack_ffffffffffffff40;
  begin.list._0_8_ = in_stack_ffffffffffffff38;
  begin.list.second._4_4_ = in_stack_ffffffffffffff44;
  ixy::operator<<(&local_30,begin,(unsigned_short *)local_38);
  debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0xe8,"start_rx_queue",&local_30);
  local_50 = std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::at
                       (&this->rx_queues,(ulong)local_12);
  if ((local_50->num_entries & local_50->num_entries - 1) != 0) {
    memset(&buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>.field_0xf,0,1);
    local_58 = ixy::operator<<("number of queue entries must be a power of 2");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0xec,"start_rx_queue",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&i);
  }
  buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = 0;
  for (; (int)buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._8_4_ < (int)(uint)local_50->num_entries;
      buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_4_ =
           buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._8_4_ + 1) {
    peVar4 = std::__shared_ptr_access<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_50->mempool);
    oVar8 = Mempool::alloc_buf(peVar4);
    local_78._M_value =
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar2 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)&local_78);
    if (!bVar2) {
      memset((void *)((long)&rxd + 7),0,1);
      local_88.list.second = (char *)ixy::operator<<("failed to allocate rx descriptor");
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                 ,0xf3,"start_rx_queue",&local_88);
    }
    piVar1 = local_50->descriptors;
    lVar7 = (long)(int)buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._8_4_;
    peVar4 = std::__shared_ptr_access<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_50->mempool);
    puVar5 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_78);
    uVar6 = Mempool::get_phys_addr(peVar4,*puVar5);
    piVar1[lVar7].read.pkt_addr = uVar6;
    *(undefined8 *)((long)(piVar1 + lVar7) + 8) = 0;
    this_00 = &local_50->bufs_in_use;
    puVar5 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,puVar5);
  }
  if (local_12 < 0x40) {
    local_b4 = (uint)local_12 * 0x40 + 0x1028;
  }
  else {
    local_b4 = (local_12 - 0x40) * 0x40 + 0xd028;
  }
  set_flags32(this,(long)local_b4,0x2000000);
  if (local_12 < 0x40) {
    local_b8 = (uint)local_12 * 0x40 + 0x1028;
  }
  else {
    local_b8 = (local_12 - 0x40) * 0x40 + 0xd028;
  }
  wait_set_reg32(this,(long)local_b8,0x2000000);
  if (local_12 < 0x40) {
    iVar3 = (uint)local_12 * 0x40 + 0x1010;
  }
  else {
    iVar3 = (local_12 - 0x40) * 0x40 + 0xd010;
  }
  set_reg32(this,(long)iVar3,0);
  if (local_12 < 0x40) {
    iVar3 = (uint)local_12 * 0x40 + 0x1018;
  }
  else {
    iVar3 = (local_12 - 0x40) * 0x40 + 0xd018;
  }
  set_reg32(this,(long)iVar3,local_50->num_entries - 1);
  return;
}

Assistant:

void IxgbeDevice::start_rx_queue(uint16_t queue_id) {
    debug("starting rx queue " << queue_id);
    auto queue = &rx_queues.at(queue_id);

    if (queue->num_entries & (queue->num_entries - 1)) {
        error("number of queue entries must be a power of 2");
    }

    for (int i = 0; i < queue->num_entries; i++) {
        auto buf = queue->mempool->alloc_buf();

        if (!buf.has_value()) {
            error("failed to allocate rx descriptor");
        }

        volatile union ixgbe_adv_rx_desc *rxd = queue->descriptors + i;
        rxd->read.pkt_addr = queue->mempool->get_phys_addr(buf.value());
        rxd->read.hdr_addr = 0;

        queue->bufs_in_use.push_back(buf.value());
    }

    // enable queue and wait if necessary
    set_flags32(IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
    wait_set_reg32(IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
    // rx queue starts out full
    set_reg32(IXGBE_RDH(queue_id), 0);
    // was set to 0 before in the init function
    set_reg32(IXGBE_RDT(queue_id), queue->num_entries - 1);
}